

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::AddRequiredTargetCFeature(cmMakefile *this,cmTarget *target,string *feature)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *__s;
  char **ppcVar4;
  char **ppcVar5;
  ostream *poVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream e;
  bool local_273;
  bool local_272;
  bool local_271;
  cmTarget *local_270;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_271 = false;
  local_272 = false;
  local_273 = false;
  CheckNeededCLanguage(this,feature,&local_271,&local_272,&local_273);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
  __s = cmTarget::GetProperty(target,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_270 = target;
  if (__s == (char *)0x0) {
    ppcVar4 = (char **)&DAT_005c9f88;
  }
  else {
    std::__cxx11::string::string((string *)local_1c8,__s,(allocator *)local_1a8);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c9f88,(cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar4 == (char **)&DAT_005c9f88) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The C_STANDARD property on target \"",0x23);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(target->Name)._M_dataplus._M_p,
                          (target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" contained an invalid value: \"",0x1f);
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_208,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    std::__cxx11::string::string((string *)local_1e8,__s,(allocator *)local_1a8);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c9f88,(cmStrCmp *)local_1e8);
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
  }
  bVar3 = local_271;
  bVar2 = local_272;
  bVar1 = local_273;
  bVar9 = __s == (char *)0x0;
  if ((!bVar9 & local_273) == 1) {
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"11","");
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c9f88,(cmStrCmp *)local_248);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    if (ppcVar5 <= ppcVar4) goto LAB_003a0c88;
LAB_003a0e71:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"11");
  }
  else {
LAB_003a0c88:
    if (__s == (char *)0x0 || bVar2 != true) {
LAB_003a0d05:
      if (__s == (char *)0x0 || bVar3 != true) {
        bVar8 = false;
      }
      else {
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"90","");
        ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_005c9f88,(cmStrCmp *)local_228);
        bVar8 = ppcVar4 < ppcVar5;
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
      }
      if ((bVar1 & bVar9) != 0) goto LAB_003a0e71;
      if ((bVar2 & bVar9) == 0) {
        if (!bVar8 && (bVar9 & bVar3) == 0) {
          return true;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
        cmTarget::SetProperty(local_270,(string *)local_1a8,"90");
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
          return true;
        }
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return true;
      }
    }
    else {
      local_268[0] = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"99","");
      ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_005c9f88,(cmStrCmp *)local_268);
      if (local_268[0] != local_258) {
        operator_delete(local_268[0],local_258[0] + 1);
      }
      if (ppcVar5 <= ppcVar4) goto LAB_003a0d05;
      if ((bVar1 & bVar9) != 0) goto LAB_003a0e71;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"99");
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::
AddRequiredTargetCFeature(cmTarget *target, const std::string& feature) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char *existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard)
    {
    if (std::find_if(cmArrayBegin(C_STANDARDS), cmArrayEnd(C_STANDARDS),
                  cmStrCmp(existingCStandard)) == cmArrayEnd(C_STANDARDS))
      {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  const char * const *existingCIt = existingCStandard
                                    ? std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp(existingCStandard))
                                    : cmArrayEnd(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("11")))
    {
    setC11 = true;
    }
  else if(needC99 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("99")))
    {
    setC99 = true;
    }
  else if(needC90 && existingCStandard && existingCIt <
                                    std::find_if(cmArrayBegin(C_STANDARDS),
                                      cmArrayEnd(C_STANDARDS),
                                      cmStrCmp("90")))
    {
    setC90 = true;
    }

  if (setC11)
    {
    target->SetProperty("C_STANDARD", "11");
    }
  else if (setC99)
    {
    target->SetProperty("C_STANDARD", "99");
    }
  else if (setC90)
    {
    target->SetProperty("C_STANDARD", "90");
    }
  return true;
}